

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

void mg_cry_internal_impl(mg_connection *conn,char *func,uint line,char *fmt,__va_list_tag *ap)

{
  _func_int_mg_connection_ptr_char_ptr *p_Var1;
  mg_connection *conn_00;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  time_t tVar5;
  mg_file *filep;
  char *pcVar6;
  undefined4 in_register_00000014;
  mg_file fi;
  char src_addr [50];
  char buf [8192];
  
  filep = (mg_file *)CONCAT44(in_register_00000014,line);
  vsnprintf(buf,0x2000,func,filep);
  buf[0x1fff] = '\0';
  if (conn == (mg_connection *)0x0) {
    puts(buf);
  }
  else {
    p_Var1 = (conn->phys_ctx->callbacks).log_message;
    if ((p_Var1 != (_func_int_mg_connection_ptr_char_ptr *)0x0) &&
       (iVar4 = (*p_Var1)(conn,buf), iVar4 != 0)) {
      return;
    }
    conn_00 = (mg_connection *)conn->dom_ctx->config[0x11];
    if (((conn_00 != (mg_connection *)0x0) &&
        (iVar4 = mg_fopen(conn_00,(char *)0x4,(int)&fi,filep), iVar4 != 0)) &&
       (fi.access.fp != (FILE *)0x0)) {
      flockfile((FILE *)fi.access.fp);
      tVar5 = time((time_t *)0x0);
      sockaddr_to_string(src_addr,0x32,&(conn->client).rsa);
      fprintf((FILE *)fi.access.fp,"[%010lu] [error] [client %s] ",tVar5,src_addr);
      pcVar2 = (conn->request_info).request_method;
      if (pcVar2 != (char *)0x0) {
        pcVar3 = (conn->request_info).request_uri;
        pcVar6 = "";
        if (pcVar3 != (char *)0x0) {
          pcVar6 = pcVar3;
        }
        fprintf((FILE *)fi.access.fp,"%s %s: ",pcVar2,pcVar6);
      }
      fputs(buf,(FILE *)fi.access.fp);
      fputc(10,(FILE *)fi.access.fp);
      fflush((FILE *)fi.access.fp);
      funlockfile((FILE *)fi.access.fp);
      mg_fclose(&fi.access);
    }
  }
  return;
}

Assistant:

static void
mg_cry_internal_impl(const struct mg_connection *conn,
                     const char *func,
                     unsigned line,
                     const char *fmt,
                     va_list ap)
{
	char buf[MG_BUF_LEN], src_addr[IP_ADDR_STR_LEN];
	struct mg_file fi;
	time_t timestamp;

	/* Unused, in the RELEASE build */
	(void)func;
	(void)line;

#if defined(GCC_DIAGNOSTIC)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wformat-nonliteral"
#endif

	IGNORE_UNUSED_RESULT(vsnprintf_impl(buf, sizeof(buf), fmt, ap));

#if defined(GCC_DIAGNOSTIC)
#pragma GCC diagnostic pop
#endif

	buf[sizeof(buf) - 1] = 0;

	DEBUG_TRACE("mg_cry called from %s:%u: %s", func, line, buf);

	if (!conn) {
		puts(buf);
		return;
	}

	/* Do not lock when getting the callback value, here and below.
	 * I suppose this is fine, since function cannot disappear in the
	 * same way string option can. */
	if ((conn->phys_ctx->callbacks.log_message == NULL)
	    || (conn->phys_ctx->callbacks.log_message(conn, buf) == 0)) {

		if (conn->dom_ctx->config[ERROR_LOG_FILE] != NULL) {
			if (mg_fopen(conn,
			             conn->dom_ctx->config[ERROR_LOG_FILE],
			             MG_FOPEN_MODE_APPEND,
			             &fi)
			    == 0) {
				fi.access.fp = NULL;
			}
		} else {
			fi.access.fp = NULL;
		}

		if (fi.access.fp != NULL) {
			flockfile(fi.access.fp);
			timestamp = time(NULL);

			sockaddr_to_string(src_addr, sizeof(src_addr), &conn->client.rsa);
			fprintf(fi.access.fp,
			        "[%010lu] [error] [client %s] ",
			        (unsigned long)timestamp,
			        src_addr);

			if (conn->request_info.request_method != NULL) {
				fprintf(fi.access.fp,
				        "%s %s: ",
				        conn->request_info.request_method,
				        conn->request_info.request_uri
				            ? conn->request_info.request_uri
				            : "");
			}

			fprintf(fi.access.fp, "%s", buf);
			fputc('\n', fi.access.fp);
			fflush(fi.access.fp);
			funlockfile(fi.access.fp);
			(void)mg_fclose(&fi.access); /* Ignore errors. We can't call
			                              * mg_cry here anyway ;-) */
		}
	}
}